

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.hpp
# Opt level: O2

Tensor<2> * Omega_h::exp_spd_old<2>(Tensor<2> m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Int i_5;
  Vector<2> *pVVar5;
  double *pdVar6;
  Int j;
  long lVar7;
  undefined8 uVar8;
  bool bVar9;
  Int i;
  long lVar10;
  Tensor<2> *in_RDI;
  char *pcVar11;
  Int i_4;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Vector<2> c_5;
  Matrix<2,_2> c;
  Matrix<2,_2> a;
  double local_f8;
  double dStack_f0;
  undefined1 local_e8 [24];
  double local_d0;
  Vector<2> c_1;
  double local_b8;
  double dStack_b0;
  Vector<2> l;
  Matrix<2,_2> b_1;
  
  pVVar5 = (Vector<2> *)&a;
  a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
       m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  dVar15 = 0.0;
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      dVar13 = ABS(((Few<Omega_h::Vector<2>,_2> *)&pVVar5->super_Few<double,_2>)->array_[0].
                   super_Few<double,_2>.array_[lVar10]);
      if (dVar13 <= dVar15) {
        dVar13 = dVar15;
      }
      dVar15 = dVar13;
    }
    pVVar5 = pVVar5 + 1;
  }
  if (dVar15 <= 1e-10) {
    pVVar5 = (Vector<2> *)&a;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        uVar12 = 0x3ff00000;
        if (lVar7 != lVar10) {
          uVar12 = 0;
        }
        ((Few<Omega_h::Vector<2>,_2> *)&pVVar5->super_Few<double,_2>)->array_[0].
        super_Few<double,_2>.array_[lVar10] = (double)((ulong)uVar12 << 0x20);
      }
      pVVar5 = pVVar5 + 1;
    }
    local_f8 = 0.0;
    dStack_f0 = 0.0;
  }
  else {
    for (lVar7 = 0;
        dVar4 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1],
        dVar3 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0],
        dVar2 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1],
        dVar13 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0],
        lVar7 != 2; lVar7 = lVar7 + 1) {
      c_5.super_Few<double,_2>.array_[0] =
           a.super_Few<Omega_h::Vector<2>,_2>.array_[lVar7].super_Few<double,_2>.array_[0];
      c_5.super_Few<double,_2>.array_[1] =
           a.super_Few<Omega_h::Vector<2>,_2>.array_[lVar7].super_Few<double,_2>.array_[1];
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        c_1.super_Few<double,_2>.array_[lVar10] = c_5.super_Few<double,_2>.array_[lVar10] / dVar15;
      }
      c.super_Few<Omega_h::Vector<2>,_2>.array_[lVar7].super_Few<double,_2>.array_[0] =
           c_1.super_Few<double,_2>.array_[0];
      c.super_Few<Omega_h::Vector<2>,_2>.array_[lVar7].super_Few<double,_2>.array_[1] =
           c_1.super_Few<double,_2>.array_[1];
    }
    dVar14 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] +
             c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    dVar16 = (c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] *
              c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] -
             c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] *
             c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0]) * -4.0 +
             dVar14 * dVar14;
    if (5e-05 <= ABS(dVar16)) {
      if (dVar16 <= 0.0) {
        uVar8 = 0x119;
        pcVar11 = "nroots == 1 && roots_obj.mults[0] == 2";
LAB_002f1b41:
        fail("assertion %s failed at %s +%d\n",pcVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
             ,uVar8);
      }
      dVar1 = SQRT(dVar16);
      local_d0 = dVar15;
      dVar15 = dVar1;
      if (dVar16 < 0.0) {
        dVar15 = sqrt(dVar16);
      }
      if (dVar16 < 0.0) {
        dVar1 = sqrt(dVar16);
      }
      dVar16 = (dVar14 - dVar1) * 0.5;
      local_e8._8_4_ = SUB84(dVar16,0);
      local_e8._0_8_ = (dVar15 + dVar14) * 0.5;
      local_e8._12_4_ = (int)((ulong)dVar16 >> 0x20);
      pcVar11 = "best_norm > EPSILON";
      for (lVar7 = 0; dVar15 = local_d0, lVar7 != 2; lVar7 = lVar7 + 1) {
        dVar15 = *(double *)(local_e8 + lVar7 * 8);
        a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] = dVar13;
        a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] = dVar2;
        a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] = dVar3;
        a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] = dVar4;
        pdVar6 = (double *)&a;
        for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 0x10) {
          *pdVar6 = *pdVar6 - dVar15;
          pdVar6 = pdVar6 + 3;
        }
        c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
             a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
             a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
             a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
        c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
             a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
        for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 8) {
          uVar8 = *(undefined8 *)
                   ((long)c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_ +
                   lVar10);
          *(undefined8 *)
           ((long)a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_ +
           lVar10 * 2) = *(undefined8 *)
                          ((long)c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                                 array_ + lVar10);
          *(undefined8 *)
           ((long)a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_ +
           lVar10 * 2 + 8) = uVar8;
        }
        dVar14 = a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] *
                 a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] +
                 a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] *
                 a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar16 = a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] *
                 a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] +
                 a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] *
                 a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
        if (dVar16 < 0.0) {
          dVar16 = sqrt(dVar16);
        }
        else {
          dVar16 = SQRT(dVar16);
        }
        dVar1 = dVar16;
        if (dVar16 <= dVar14) {
          dVar1 = dVar14;
        }
        if (dVar1 <= 1e-10) {
          uVar8 = 0xd3;
          goto LAB_002f1b41;
        }
        c_5.super_Few<double,_2>.array_[0] =
             a.super_Few<Omega_h::Vector<2>,_2>.array_[dVar14 < dVar16].super_Few<double,_2>.array_
             [0];
        c_5.super_Few<double,_2>.array_[1] =
             a.super_Few<Omega_h::Vector<2>,_2>.array_[dVar14 < dVar16].super_Few<double,_2>.array_
             [1];
        for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
          c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar10] =
               c_5.super_Few<double,_2>.array_[lVar10] / dVar1;
        }
        (&c_1)[lVar7].super_Few<double,_2>.array_[0] =
             -c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
        (&c_1)[lVar7].super_Few<double,_2>.array_[1] =
             c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
        l.super_Few<double,_2>.array_[lVar7] = dVar15;
      }
    }
    else {
      pVVar5 = (Vector<2> *)&a;
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
          uVar12 = 0x3ff00000;
          if (lVar7 != lVar10) {
            uVar12 = 0;
          }
          ((Few<Omega_h::Vector<2>,_2> *)&pVVar5->super_Few<double,_2>)->array_[0].
          super_Few<double,_2>.array_[lVar10] = (double)((ulong)uVar12 << 0x20);
        }
        pVVar5 = pVVar5 + 1;
      }
      local_b8 = a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
      dStack_b0 = a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      c_1.super_Few<double,_2>.array_[0] =
           a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
      c_1.super_Few<double,_2>.array_[1] =
           a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
      l.super_Few<double,_2>.array_[0] = dVar14 * 0.5;
      l.super_Few<double,_2>.array_[1] = dVar14 * 0.5;
    }
    a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] = local_b8;
    a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] = dStack_b0;
    a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
         c_1.super_Few<double,_2>.array_[0];
    a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
         c_1.super_Few<double,_2>.array_[1];
    c_1.super_Few<double,_2>.array_[0] = l.super_Few<double,_2>.array_[0];
    c_1.super_Few<double,_2>.array_[1] = l.super_Few<double,_2>.array_[1];
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar7] =
           c_1.super_Few<double,_2>.array_[lVar7] * dVar15;
    }
    local_f8 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    dStack_f0 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  }
  for (lVar7 = 4; lVar7 != 6; lVar7 = lVar7 + 1) {
    dVar15 = exp(a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar7]);
    a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar7] = dVar15;
  }
  c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] = local_f8;
  c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] = 0.0;
  c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] = 0.0;
  c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] = dStack_f0;
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    dVar15 = c.super_Few<Omega_h::Vector<2>,_2>.array_[lVar7].super_Few<double,_2>.array_[0];
    dVar13 = c.super_Few<Omega_h::Vector<2>,_2>.array_[lVar7].super_Few<double,_2>.array_[1];
    local_e8._8_8_ = a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    local_e8._0_8_ = a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      c_5.super_Few<double,_2>.array_[lVar10] = *(double *)(local_e8 + lVar10 * 8) * dVar15;
    }
    bVar9 = true;
    while (dVar2 = c_5.super_Few<double,_2>.array_[1], dVar15 = c_5.super_Few<double,_2>.array_[0],
          bVar9) {
      local_e8._0_8_ = a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
      local_e8._8_8_ = a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        c_5.super_Few<double,_2>.array_[lVar10] = *(double *)(local_e8 + lVar10 * 8) * dVar13;
      }
      local_e8._8_8_ = dVar2;
      local_e8._0_8_ = dVar15;
      l.super_Few<double,_2>.array_[0] = c_5.super_Few<double,_2>.array_[0];
      l.super_Few<double,_2>.array_[1] = c_5.super_Few<double,_2>.array_[1];
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        c_5.super_Few<double,_2>.array_[lVar10] =
             *(double *)(local_e8 + lVar10 * 8) + l.super_Few<double,_2>.array_[lVar10];
      }
      bVar9 = false;
    }
    (&c_1)[lVar7].super_Few<double,_2>.array_[0] = c_5.super_Few<double,_2>.array_[0];
    (&c_1)[lVar7].super_Few<double,_2>.array_[1] = c_5.super_Few<double,_2>.array_[1];
  }
  c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
       a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
       a.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
       a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
       a.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
    uVar8 = *(undefined8 *)
             ((long)c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_ + lVar7
             );
    *(undefined8 *)
     ((long)b_1.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_ + lVar7 * 2)
         = *(undefined8 *)
            ((long)c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_ + lVar7)
    ;
    *(undefined8 *)
     ((long)b_1.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_ +
     lVar7 * 2 + 8) = uVar8;
  }
  for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
    dVar15 = b_1.super_Few<Omega_h::Vector<2>,_2>.array_[lVar7].super_Few<double,_2>.array_[0];
    dVar13 = b_1.super_Few<Omega_h::Vector<2>,_2>.array_[lVar7].super_Few<double,_2>.array_[1];
    c_5.super_Few<double,_2>.array_[0] = c_1.super_Few<double,_2>.array_[0];
    c_5.super_Few<double,_2>.array_[1] = c_1.super_Few<double,_2>.array_[1];
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar10] =
           c_5.super_Few<double,_2>.array_[lVar10] * dVar15;
    }
    bVar9 = true;
    while (dVar2 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1],
          dVar15 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0],
          bVar9) {
      c_5.super_Few<double,_2>.array_[0] = local_b8;
      c_5.super_Few<double,_2>.array_[1] = dStack_b0;
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar10] =
             c_5.super_Few<double,_2>.array_[lVar10] * dVar13;
      }
      c_5.super_Few<double,_2>.array_[0] = dVar15;
      c_5.super_Few<double,_2>.array_[1] = dVar2;
      local_e8._8_8_ = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
      local_e8._0_8_ = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[lVar10] =
             c_5.super_Few<double,_2>.array_[lVar10] + *(double *)(local_e8 + lVar10 * 8);
      }
      bVar9 = false;
    }
    pVVar5 = (in_RDI->super_Few<Omega_h::Vector<2>,_2>).array_ + lVar7;
    (pVVar5->super_Few<double,_2>).array_[0] =
         c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    (pVVar5->super_Few<double,_2>).array_[1] =
         c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  }
  return in_RDI;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> exp_spd_old(
    Tensor<dim> const m) OMEGA_H_NOEXCEPT {
  auto decomp = decompose_eigen(m);
  for (Int i = 0; i < dim; ++i) decomp.l[i] = std::exp(decomp.l[i]);
  return compose_ortho(decomp.q, decomp.l);
}